

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O2

void SectionHdrWrapper::initSecCharacter
               (map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
                *secHdrCharact)

{
  mapped_type *pmVar1;
  key_type_conflict2 local_14;
  
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"readable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"writeable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"executable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"contains extended relocations");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"discardable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"not cachable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"non-pageable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"shareable");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"code");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"initialized data");
  pmVar1 = std::
           map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
           ::operator[](secHdrCharact,&local_14);
  QString::operator=(pmVar1,"uninitialized data");
  return;
}

Assistant:

void SectionHdrWrapper::initSecCharacter(std::map<DWORD, QString> &secHdrCharact)
{
    secHdrCharact[SCN_MEM_READ] = "readable";
    secHdrCharact[SCN_MEM_WRITE] = "writeable";
    secHdrCharact[SCN_MEM_EXECUTE] = "executable";

    secHdrCharact[SCN_LNK_NRELOC_OVFL] = "contains extended relocations";
    secHdrCharact[SCN_MEM_DISCARDABLE] = "discardable";
    secHdrCharact[SCN_MEM_NOT_CACHED] = "not cachable";
    secHdrCharact[SCN_MEM_NOT_PAGED] = "non-pageable";
    secHdrCharact[SCN_MEM_SHARED] = "shareable";
    secHdrCharact[SCN_CNT_CODE] = "code";
    secHdrCharact[SCN_CNT_INITIALIZED_DATA] = "initialized data";
    secHdrCharact[SCN_CNT_UNINITIALIZED_DATA] = "uninitialized data";
}